

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O2

uint __thiscall
glcts::GeometryShaderRenderingLinesCase::getAmountOfVerticesPerInstance
          (GeometryShaderRenderingLinesCase *this)

{
  uint uVar1;
  TestError *this_00;
  
  uVar1 = this->m_drawcall_mode - 1;
  if ((uVar1 < 0xb) && ((0x607U >> (uVar1 & 0x1f) & 1) != 0)) {
    return *(uint *)(&DAT_017a07b8 + (ulong)uVar1 * 4);
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Unrecognized draw call mode",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
             ,0xa0d);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

unsigned int GeometryShaderRenderingLinesCase::getAmountOfVerticesPerInstance()
{
	unsigned int result = 0;

	switch (m_drawcall_mode)
	{
	case GL_LINE_LOOP:
		result = 4;
		break;
	case GL_LINE_STRIP:
		result = 5;
		break;
	case GL_LINE_STRIP_ADJACENCY_EXT:
		result = 7;
		break;
	case GL_LINES:
		result = 8;
		break;
	case GL_LINES_ADJACENCY_EXT:
		result = 16;
		break;

	default:
	{
		TCU_FAIL("Unrecognized draw call mode");
	}
	} /* switch (m_drawcall_mode) */

	return result;
}